

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_parser_parsePrimaryTerm(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t elements;
  char *errorMessage;
  size_t endIndex;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  switch(iVar1) {
  case 0:
  case 1:
  case 3:
  case 7:
  case 8:
    sVar2 = sysbvm_parser_parseLiteralTokenValue(context,state);
    return sVar2;
  case 2:
  case 5:
  case 6:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x14:
  case 0x19:
    sVar2 = sysbvm_parser_parseIdentifierReferenceReference(context,state);
    return sVar2;
  default:
    sVar2 = sysbvm_parser_unexpectedTokenAt(context,state);
    return sVar2;
  case 9:
    break;
  case 0xd:
    sVar2 = sysbvm_parser_parseBlockExpression(context,state);
    return sVar2;
  case 0x1e:
    sVar2 = sysbvm_parser_parseByteArrayExpression(context,state);
    return sVar2;
  case 0x1f:
    sVar2 = sysbvm_parser_parseDictionaryExpression(context,state);
    return sVar2;
  case 0x20:
    sVar2 = sysbvm_parser_parseLiteralArrayExpression(context,state);
    return sVar2;
  case -1:
    return 0;
  }
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 9) {
    startIndex = state->tokenPosition;
    state->tokenPosition = startIndex + 1;
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if ((iVar1 == 4) && (iVar1 = sysbvm_parser_lookKindAt(state,1), iVar1 == 10)) {
      sVar2 = sysbvm_parser_parseIdentifierReferenceReference(context,state);
    }
    else {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 == 10) {
        endIndex = state->tokenPosition + 1;
        state->tokenPosition = endIndex;
        sVar2 = sysbvm_parser_makeSourcePositionForTokenRange
                          (context,state->sourceCode,state->tokenSequence,startIndex,endIndex);
        elements = sysbvm_array_create(context,0);
        sVar2 = sysbvm_astMakeArrayNode_create(context,sVar2,elements);
        return sVar2;
      }
      sVar2 = sysbvm_parser_parseCommaExpression(context,state);
    }
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 10) {
      state->tokenPosition = state->tokenPosition + 1;
      return sVar2;
    }
    sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    errorMessage = "Expected a right parenthesis.";
  }
  else {
    sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    errorMessage = "Expected a left parenthesis.";
  }
  sVar2 = sysbvm_astErrorNode_createWithCString(context,sVar2,errorMessage);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parsePrimaryTerm(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    switch(sysbvm_parser_lookKindAt(state, 0))
    {
    case -1: return SYSBVM_NULL_TUPLE;
    case SYSBVM_TOKEN_KIND_IDENTIFIER:
    case SYSBVM_TOKEN_KIND_ELLIPSIS:
    case SYSBVM_TOKEN_KIND_OPERATOR:
    case SYSBVM_TOKEN_KIND_BAR:
    case SYSBVM_TOKEN_KIND_STAR:
    case SYSBVM_TOKEN_KIND_LESS_THAN:
    case SYSBVM_TOKEN_KIND_GREATER_THAN:
    case SYSBVM_TOKEN_KIND_MULTI_KEYWORD:
        return sysbvm_parser_parseIdentifierReferenceReference(context, state);

    case SYSBVM_TOKEN_KIND_CHARACTER:
    case SYSBVM_TOKEN_KIND_INTEGER:
    case SYSBVM_TOKEN_KIND_FLOAT:
    case SYSBVM_TOKEN_KIND_STRING:
    case SYSBVM_TOKEN_KIND_SYMBOL:
        return sysbvm_parser_parseLiteralTokenValue(context, state);

    case SYSBVM_TOKEN_KIND_LPARENT:
        return sysbvm_parser_parseParenthesesExpression(context, state);
    case SYSBVM_TOKEN_KIND_LCBRACKET:
        return sysbvm_parser_parseBlockExpression(context, state);
    case SYSBVM_TOKEN_KIND_LITERAL_ARRAY_START:
        return sysbvm_parser_parseLiteralArrayExpression(context, state);
    case SYSBVM_TOKEN_KIND_BYTE_ARRAY_START:
        return sysbvm_parser_parseByteArrayExpression(context, state);
    case SYSBVM_TOKEN_KIND_DICTIONARY_START:
        return sysbvm_parser_parseDictionaryExpression(context, state);

    default:
        return sysbvm_parser_unexpectedTokenAt(context, state);
    }
}